

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::ArrayTest_Basic_Test::~ArrayTest_Basic_Test(ArrayTest_Basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArrayTest, Basic) {
  Array<int> array;
  EXPECT_TRUE(array.empty());
  EXPECT_EQ(array.size(), 0u);
  const int v[] = {1, 2, 3, 4};
  ASSERT_TRUE(array.CopyFrom(v));
  EXPECT_FALSE(array.empty());
  EXPECT_EQ(array.size(), 4u);
  EXPECT_EQ(array[0], 1);
  EXPECT_EQ(array[1], 2);
  EXPECT_EQ(array[2], 3);
  EXPECT_EQ(array[3], 4);
  EXPECT_EQ(array.front(), 1);
  EXPECT_EQ(array.back(), 4);
}